

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_allocator.cpp
# Opt level: O1

void __thiscall
duckdb::ColumnDataAllocator::UnswizzlePointers
          (ColumnDataAllocator *this,ChunkManagementState *state,Vector *result,idx_t v_offset,
          uint16_t count,uint32_t block_id,uint32_t offset)

{
  unsigned_long *puVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  data_ptr_t pdVar5;
  uint *puVar6;
  long lVar7;
  data_ptr_t pdVar8;
  data_ptr_t pdVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  if (iVar2 != 0) {
    ::std::__throw_system_error(iVar2);
  }
  FlatVector::VerifyFlatVector(result);
  pdVar8 = result->data;
  uVar3 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(v_offset);
  uVar4 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(count + v_offset);
  uVar12 = (ulong)uVar4;
  uVar11 = (ulong)uVar3;
  if (uVar3 < uVar4) {
    puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    uVar10 = (ulong)uVar3;
    puVar6 = (uint *)(pdVar8 + uVar10 * 0x10);
    do {
      if (((puVar1 == (unsigned_long *)0x0) || ((puVar1[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0))
         && (uVar11 = uVar10, 0xc < *puVar6)) break;
      uVar10 = uVar10 + 1;
      puVar6 = puVar6 + 4;
      uVar11 = uVar12;
    } while (uVar12 != uVar10);
  }
  pdVar5 = GetDataPointer(this,state,block_id,offset);
  uVar10 = uVar11 & 0xffffffff;
  lVar7 = uVar10 * 0x10;
  if (*(uint *)(pdVar8 + lVar7) < 0xd) {
    pdVar9 = pdVar8 + lVar7 + 4;
  }
  else {
    pdVar9 = *(data_ptr_t *)(pdVar8 + lVar7 + 8);
  }
  if ((pdVar9 != pdVar5) && ((uint)uVar11 < uVar4)) {
    pdVar8 = pdVar8 + lVar7 + 8;
    do {
      puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (((puVar1 == (unsigned_long *)0x0) || ((puVar1[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0))
         && (0xc < (ulong)*(uint *)(pdVar8 + -8))) {
        *(data_ptr_t *)pdVar8 = pdVar5;
        pdVar5 = pdVar5 + *(uint *)(pdVar8 + -8);
      }
      uVar10 = uVar10 + 1;
      pdVar8 = pdVar8 + 0x10;
    } while (uVar12 != uVar10);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
  return;
}

Assistant:

void ColumnDataAllocator::UnswizzlePointers(ChunkManagementState &state, Vector &result, idx_t v_offset, uint16_t count,
                                            uint32_t block_id, uint32_t offset) {
	D_ASSERT(result.GetType().InternalType() == PhysicalType::VARCHAR);
	lock_guard<mutex> guard(lock);

	auto &validity = FlatVector::Validity(result);
	auto strings = FlatVector::GetData<string_t>(result);

	// find first non-inlined string
	auto i = NumericCast<uint32_t>(v_offset);
	const uint32_t end = NumericCast<uint32_t>(v_offset + count);
	for (; i < end; i++) {
		if (!validity.RowIsValid(i)) {
			continue;
		}
		if (!strings[i].IsInlined()) {
			break;
		}
	}
	// at least one string must be non-inlined, otherwise this function should not be called
	D_ASSERT(i < end);

	auto base_ptr = char_ptr_cast(GetDataPointer(state, block_id, offset));
	if (strings[i].GetData() == base_ptr) {
		// pointers are still valid
		return;
	}

	// pointer mismatch! pointers are invalid, set them correctly
	for (; i < end; i++) {
		if (!validity.RowIsValid(i)) {
			continue;
		}
		if (strings[i].IsInlined()) {
			continue;
		}
		strings[i].SetPointer(base_ptr);
		base_ptr += strings[i].GetSize();
	}
}